

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::structArrayCheck(TParseContext *this,TSourceLoc *param_1,TType *type)

{
  pointer pTVar1;
  long *plVar2;
  char cVar3;
  TTypeList *pTVar4;
  TArraySizes *arraySizes;
  int m;
  long lVar5;
  long lVar6;
  
  pTVar4 = TType::getStruct(type);
  lVar6 = 8;
  lVar5 = 0;
  while( true ) {
    pTVar1 = (pTVar4->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(pTVar4->
                            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ).
                            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) >> 5) <=
        lVar5) break;
    plVar2 = *(long **)((long)pTVar1 + lVar6 + -8);
    cVar3 = (**(code **)(*plVar2 + 0xe8))(plVar2);
    if (cVar3 != '\0') {
      pTVar1 = (pTVar4->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
               ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      arraySizes = (TArraySizes *)(**(code **)(*plVar2 + 0x98))(plVar2);
      arraySizeRequiredCheck(this,(TSourceLoc *)((long)&pTVar1->type + lVar6),arraySizes);
    }
    lVar5 = lVar5 + 1;
    lVar6 = lVar6 + 0x20;
  }
  return;
}

Assistant:

void TParseContext::structArrayCheck(const TSourceLoc& /*loc*/, const TType& type)
{
    const TTypeList& structure = *type.getStruct();
    for (int m = 0; m < (int)structure.size(); ++m) {
        const TType& member = *structure[m].type;
        if (member.isArray())
            arraySizeRequiredCheck(structure[m].loc, *member.getArraySizes());
    }
}